

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speed.c
# Opt level: O0

int readimage(fitsfile *fptr,int *status)

{
  int iVar1;
  long *in_RSI;
  long in_RDI;
  LONGLONG unaff_retaddr;
  LONGLONG in_stack_00000008;
  double elapse;
  float cpufrac;
  float elapcpu;
  float size;
  float rate;
  long longnull;
  long ii;
  long nremain;
  int hdutype;
  int anynull;
  double local_48;
  undefined4 in_stack_ffffffffffffffc0;
  float in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  double *elapse_00;
  long local_28;
  
  elapse_00 = (double *)0x0;
  iVar1 = ffmahd((fitsfile *)longnull,(int)rate,&_cpufrac->HDUposition,(int *)elapse);
  if (iVar1 != 0) {
    printerror((int)rate);
  }
  printf("\nRead back image                                 ");
  marktime((int *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  for (local_28 = 1; local_28 < 0x895441; local_28 = local_28 + 20000) {
    ffgpvj(_cpufrac,(long)elapse,in_stack_00000008,unaff_retaddr,in_RDI,in_RSI,_hdutype,status);
  }
  gettime(elapse_00,(float *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
          (int *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  printf(" %4.1fMB/%6.3fs(%3.0f) = %5.2fMB/s\n",0x4042000000000000,local_48,
         (double)(float)(((double)in_stack_ffffffffffffffc4 / local_48) * 100.0),
         (double)(float)(36.0 / local_48));
  return (int)*in_RSI;
}

Assistant:

int readimage( fitsfile *fptr, int *status )

    /*********************/
    /* Read a FITS image */
    /*********************/
{
    int anynull, hdutype;
    long nremain, ii;
    long longnull = 0;
    float rate, size, elapcpu, cpufrac;
    double elapse;

    /* move to the primary array */
    if ( fits_movabs_hdu(fptr, 1, &hdutype, status) ) 
         printerror( *status );

    printf("\nRead back image                                 ");
    marktime(status);

    nremain = XSIZE * YSIZE;
    for (ii=1; ii <= nremain; ii += SHTSIZE)
    {
      ffgpvj(fptr, 0, ii, SHTSIZE, longnull, sarray, &anynull, status);
    }

    gettime(&elapse, &elapcpu, status);

    cpufrac = elapcpu / elapse * 100.;
    size = XSIZE * 4. * YSIZE / 1000000.;
    rate = size / elapse;
    printf(" %4.1fMB/%6.3fs(%3.0f) = %5.2fMB/s\n", size, elapse, cpufrac,rate);

    return( *status );
}